

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPolyhedralContactClipping.cpp
# Opt level: O0

void InverseTransformPoint3x3(btVector3 *out,btVector3 *in,btTransform *tr)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  btScalar *pbVar6;
  btTransform *in_RDX;
  btVector3 *in_RSI;
  btVector3 *in_RDI;
  btScalar z;
  btScalar y;
  btScalar x;
  btVector3 *r2;
  btVector3 *r1;
  btVector3 *r0;
  btMatrix3x3 *rot;
  float local_44;
  float local_40;
  float local_3c;
  btVector3 *local_38;
  btVector3 *local_30;
  btVector3 *local_28;
  btMatrix3x3 *local_20;
  btVector3 *local_10;
  btVector3 *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = btTransform::getBasis(in_RDX);
  local_28 = btMatrix3x3::operator[](local_20,0);
  local_30 = btMatrix3x3::operator[](local_20,1);
  local_38 = btMatrix3x3::operator[](local_20,2);
  pbVar6 = btVector3::x(local_28);
  fVar1 = *pbVar6;
  pbVar6 = btVector3::x(local_10);
  fVar2 = *pbVar6;
  pbVar6 = btVector3::x(local_30);
  fVar3 = *pbVar6;
  pbVar6 = btVector3::y(local_10);
  fVar4 = *pbVar6;
  pbVar6 = btVector3::x(local_38);
  fVar5 = *pbVar6;
  pbVar6 = btVector3::z(local_10);
  local_3c = fVar5 * *pbVar6 + fVar1 * fVar2 + fVar3 * fVar4;
  pbVar6 = btVector3::y(local_28);
  fVar1 = *pbVar6;
  pbVar6 = btVector3::x(local_10);
  fVar2 = *pbVar6;
  pbVar6 = btVector3::y(local_30);
  fVar3 = *pbVar6;
  pbVar6 = btVector3::y(local_10);
  fVar4 = *pbVar6;
  pbVar6 = btVector3::y(local_38);
  fVar5 = *pbVar6;
  pbVar6 = btVector3::z(local_10);
  local_40 = fVar5 * *pbVar6 + fVar1 * fVar2 + fVar3 * fVar4;
  pbVar6 = btVector3::z(local_28);
  fVar1 = *pbVar6;
  pbVar6 = btVector3::x(local_10);
  fVar2 = *pbVar6;
  pbVar6 = btVector3::z(local_30);
  fVar3 = *pbVar6;
  pbVar6 = btVector3::y(local_10);
  fVar4 = *pbVar6;
  pbVar6 = btVector3::z(local_38);
  fVar5 = *pbVar6;
  pbVar6 = btVector3::z(local_10);
  local_44 = fVar5 * *pbVar6 + fVar1 * fVar2 + fVar3 * fVar4;
  btVector3::setValue(local_8,&local_3c,&local_40,&local_44);
  return;
}

Assistant:

void InverseTransformPoint3x3(btVector3& out, const btVector3& in, const btTransform& tr)
{
	const btMatrix3x3& rot = tr.getBasis();
	const btVector3& r0 = rot[0];
	const btVector3& r1 = rot[1];
	const btVector3& r2 = rot[2];

	const btScalar x = r0.x()*in.x() + r1.x()*in.y() + r2.x()*in.z();
	const btScalar y = r0.y()*in.x() + r1.y()*in.y() + r2.y()*in.z();
	const btScalar z = r0.z()*in.x() + r1.z()*in.y() + r2.z()*in.z();

	out.setValue(x, y, z);
}